

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

uint32 __thiscall
Clasp::Solver::finalizeConflictClause(Solver *this,LitVec *cc,ConstraintInfo *info,uint32 ccRepMode)

{
  pointer pLVar1;
  uint *puVar2;
  uint32 uVar3;
  pointer pDVar4;
  pointer puVar5;
  pointer pAVar6;
  uint64 uVar7;
  pointer pLVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Literal p;
  ulong uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  pointer pLVar18;
  ulong uVar19;
  size_type sVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  Literal local_44;
  ConstraintInfo *local_40;
  Literal local_34;
  
  uVar13 = ((cc->ebo_).buf)->rep_ >> 2;
  uVar9 = (this->tag_).rep_;
  if ((cc->ebo_).size == 1) {
    uVar22 = 0;
    sVar20 = 1;
    bVar14 = 0;
  }
  else {
    iVar21 = 0;
    sVar20 = 1;
    uVar22 = 0;
    uVar12 = 1;
    bVar14 = 0;
    uVar16 = 1;
    do {
      pLVar8 = (cc->ebo_).buf;
      uVar11 = pLVar8[uVar16].rep_;
      uVar15 = uVar11 >> 2;
      puVar5 = (this->assign_).assign_.ebo_.buf;
      uVar19 = (ulong)(uVar11 & 0xfffffffc);
      uVar11 = *(uint *)((long)puVar5 + uVar19);
      *(uint *)((long)puVar5 + uVar19) = uVar11 & 0xfffffff3;
      uVar10 = pLVar8[uVar16].rep_;
      if (uVar15 <= uVar13) {
        uVar15 = uVar13;
      }
      uVar13 = uVar15;
      uVar11 = uVar11 >> 4;
      if ((uint)uVar22 < uVar11) {
        uVar22 = (ulong)uVar11;
        uVar12 = uVar16;
      }
      pDVar4 = (this->levels_).super_type.ebo_.buf;
      uVar15 = *(uint *)(pDVar4 + (uVar11 - 1));
      if ((uVar15 >> 0x1e & 1) != 0) {
        *(uint *)(pDVar4 + (uVar11 - 1)) = uVar15 & 0xbfffffff;
        uVar15 = (this->levels_).root;
        bVar23 = iVar21 == 0;
        iVar21 = iVar21 + (uint)(uVar11 <= uVar15);
        sVar20 = sVar20 + (bVar23 || uVar15 < uVar11);
      }
      bVar14 = bVar14 | (uVar10 ^ uVar9 ^ 2) < 2;
      uVar11 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar11;
    } while (uVar11 != (cc->ebo_).size);
    if ((int)uVar12 != 1) {
      pLVar8 = (cc->ebo_).buf;
      uVar3 = pLVar8[1].rep_;
      pLVar8[1].rep_ = pLVar8[uVar12].rep_;
      pLVar8[uVar12].rep_ = uVar3;
    }
  }
  uVar3 = (uint32)uVar22;
  local_40 = info;
  if (ccRepMode == 0) goto LAB_0016bf0e;
  if (ccRepMode == 3) {
    pLVar8 = (cc->ebo_).buf;
    uVar13 = pLVar8->rep_ >> 2;
    if ((double)sVar20 / (double)(this->levels_).super_type.ebo_.size <= 0.66) {
LAB_0016bd04:
      sVar20 = (cc->ebo_).size;
      iVar21 = sVar20 - 1;
      if (1 < sVar20) {
        puVar5 = (this->assign_).assign_.ebo_.buf;
        do {
          puVar2 = (uint *)((long)puVar5 + (ulong)(pLVar8[sVar20 - 1].rep_ & 0xfffffffc));
          *puVar2 = *puVar2 | (uint)((pLVar8[sVar20 - 1].rep_ & 2) == 0) * 4 + 4;
          sVar20 = (cc->ebo_).size - 1;
          (cc->ebo_).size = sVar20;
        } while (1 < sVar20);
      }
      if (iVar21 == 0) {
        bVar14 = 0;
      }
      else {
        pLVar8 = (this->assign_).trail.ebo_.buf + (this->assign_).trail.ebo_.size;
        bVar14 = 0;
        do {
          puVar5 = (this->assign_).assign_.ebo_.buf;
          do {
            uVar11 = pLVar8[-1].rep_;
            pLVar8 = pLVar8 + -1;
            uVar10 = *(uint *)((long)puVar5 + (ulong)(uVar11 & 0xfffffffc));
          } while (((uVar11 & 2) * 2 + 4 & uVar10) == 0);
          uVar11 = uVar11 >> 2;
          iVar21 = iVar21 + -1;
          if (iVar21 == 0) {
            puVar5[uVar11] = uVar10 & 0xfffffff3;
            p.rep_ = pLVar8->rep_;
LAB_0016bebe:
            local_44.rep_ = p.rep_ & 0xfffffffe ^ 2;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (cc,&local_44);
            uVar11 = pLVar8->rep_ >> 2;
            bVar14 = bVar14 | uVar11 == uVar9 >> 2;
            if (uVar13 < uVar11) {
              uVar13 = uVar11;
            }
          }
          else {
            pAVar6 = (this->assign_).reason_.super_type.ebo_.buf;
            uVar7 = pAVar6[uVar11].data_;
            puVar5[uVar11] = uVar10 & 0xfffffff3;
            p.rep_ = pLVar8->rep_;
            if (uVar7 == 0) goto LAB_0016bebe;
            uVar11 = *(uint *)((long)puVar5 + (ulong)(p.rep_ & 0xfffffffc));
            pLVar18 = pLVar8;
            do {
              pLVar1 = pLVar18 + -1;
              uVar10 = pLVar1->rep_ >> 2;
              if (pLVar18 ==
                  (pointer)((long)&((this->assign_).trail.ebo_.buf)->rep_ +
                           (ulong)(uint)(*(int *)((this->levels_).super_type.ebo_.buf +
                                                 ((uVar11 >> 4) - 1)) << 2))) break;
              pLVar18 = pLVar18 + -1;
            } while ((puVar5[uVar10] & (pLVar1->rep_ & 2) * 2 + 4) == 0);
            if (0xf < (uVar11 ^ puVar5[uVar10])) goto LAB_0016bebe;
            (this->conflict_).ebo_.size = 0;
            Antecedent::reason(pAVar6 + (p.rep_ >> 2),this,p,&this->conflict_);
            sVar20 = (this->conflict_).ebo_.size;
            if (sVar20 != 0) {
              puVar5 = (this->assign_).assign_.ebo_.buf;
              pLVar18 = (this->conflict_).ebo_.buf;
              do {
                uVar10 = pLVar18[sVar20 - 1].rep_;
                uVar15 = *(uint *)((long)puVar5 + (ulong)(uVar10 & 0xfffffffc));
                uVar11 = (uVar10 & 2) * 2 + 4;
                if ((uVar11 & uVar15) == 0) {
                  iVar21 = iVar21 + 1;
                  puVar5[uVar10 >> 2] = uVar11 | uVar15;
                  sVar20 = (this->conflict_).ebo_.size;
                }
                sVar20 = sVar20 - 1;
                (this->conflict_).ebo_.size = sVar20;
              } while (sVar20 != 0);
            }
          }
        } while (iVar21 != 0);
        sVar20 = (cc->ebo_).size;
      }
      goto LAB_0016bf0e;
    }
  }
  else {
    pLVar8 = (cc->ebo_).buf;
    uVar13 = pLVar8->rep_ >> 2;
    if (ccRepMode != 1) goto LAB_0016bd04;
  }
  sVar20 = uVar3 + 1;
  local_34.rep_ = 0;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::resize(cc,sVar20,&local_34);
  if (uVar3 == 0) {
    sVar20 = 1;
    bVar14 = 0;
  }
  else {
    pLVar8 = (this->assign_).trail.ebo_.buf;
    pDVar4 = (this->levels_).super_type.ebo_.buf;
    pLVar18 = (cc->ebo_).buf;
    lVar17 = uVar22 << 2;
    bVar14 = 0;
    do {
      pLVar18 = pLVar18 + 1;
      uVar11 = *(uint *)((long)&pLVar8->rep_ +
                        (ulong)(uint)(*(int *)(&pDVar4[-1].field_0x0 + lVar17 * 4) << 2));
      bVar14 = bVar14 | (uVar11 ^ uVar9) < 2;
      uVar10 = uVar11 >> 2;
      if (uVar11 >> 2 <= uVar13) {
        uVar10 = uVar13;
      }
      uVar13 = uVar10;
      pLVar18->rep_ = uVar11 & 0xfffffffe ^ 2;
      lVar17 = lVar17 + -4;
    } while (lVar17 != 0);
  }
LAB_0016bf0e:
  uVar9 = 0x7f;
  if (sVar20 < 0x7f) {
    uVar9 = sVar20;
  }
  uVar10 = uVar9 << 0x14 | (this->ccInfo_).super_ConstraintScore.rep & 0xfffff;
  uVar9 = (local_40->super_ConstraintScore).rep;
  uVar15 = uVar9 & 0xf0000000;
  uVar11 = uVar15 + uVar10 + 0x80000000;
  if (!(bool)((int)uVar9 < 0 ^ bVar14)) {
    uVar11 = uVar15 | uVar10;
  }
  (local_40->super_ConstraintScore).rep = uVar11;
  if ((this->shared_->varInfo_).ebo_.size - 1 < uVar13 != (bool)((byte)(uVar11 >> 0x1e) & 1)) {
    (local_40->super_ConstraintScore).rep = uVar11 ^ 0x40000000;
  }
  return uVar3;
}

Assistant:

uint32 Solver::finalizeConflictClause(LitVec& cc, ConstraintInfo& info, uint32 ccRepMode) {
	// 2. clear flags and compute lbd
	uint32  lbd         = 1;
	uint32  onRoot      = 0;
	uint32  varLevel    = 0;
	uint32  assertLevel = 0;
	uint32  assertPos   = 1;
	uint32  maxVar      = cc[0].var();
	Literal tagLit      = ~tagLiteral();
	bool    tagged      = false;
	for (LitVec::size_type i = 1; i != cc.size(); ++i) {
		Var v = cc[i].var();
		clearSeen(v);
		if (cc[i] == tagLit) { tagged = true; }
		if (v > maxVar)      { maxVar = v;    }
		if ( (varLevel = level(v)) > assertLevel ) {
			assertLevel = varLevel;
			assertPos   = static_cast<uint32>(i);
		}
		if (hasLevel(varLevel)) {
			unmarkLevel(varLevel);
			lbd += (varLevel > rootLevel()) || (++onRoot == 1);
		}
	}
	if (assertPos != 1) { std::swap(cc[1], cc[assertPos]); }
	if (ccRepMode == SolverStrategies::cc_rep_dynamic) {
		ccRepMode = double(lbd)/double(decisionLevel()) > .66 ? SolverStrategies::cc_rep_decision : SolverStrategies::cc_rep_uip;
	}
	if (ccRepMode) {
		maxVar = cc[0].var(), tagged = false, lbd = 1;
		if (ccRepMode == SolverStrategies::cc_rep_decision) {
			// replace cc with decision sequence
			cc.resize(assertLevel+1);
			for (uint32 i = assertLevel; i;){
				Literal x = ~decision(i--);
				cc[lbd++] = x;
				if (x == tagLit)     { tagged = true; }
				if (x.var() > maxVar){ maxVar = x.var(); }
			}
		}
		else {
			// replace cc with all uip clause
			uint32 marked = sizeVec(cc) - 1;
			while (cc.size() > 1) { markSeen(~cc.back()); cc.pop_back(); }
			for (LitVec::const_iterator tr = assign_.trail.end(), next, stop; marked;) {
				while (!seen(*--tr)) { ; }
				bool n = --marked != 0 && !reason(*tr).isNull();
				clearSeen(tr->var());
				if (n) { for (next = tr, stop = assign_.trail.begin() + levelStart(level(tr->var())); next-- != stop && !seen(*next);) { ; } }
				if (!n || level(next->var()) != level(tr->var())) {
					cc.push_back(~*tr);
					if (tr->var() == tagLit.var()){ tagged = true; }
					if (tr->var() > maxVar)       { maxVar = tr->var(); }
				}
				else {
					for (reason(*tr, conflict_); !conflict_.empty(); conflict_.pop_back()) {
						if (!seen(conflict_.back())) { ++marked; markSeen(conflict_.back()); }
					}
				}
			}
			lbd = sizeVec(cc);
		}
	}
	info.setScore(makeScore(ccInfo_.activity(), lbd));
	info.setTagged(tagged);
	info.setAux(auxVar(maxVar));
	return assertLevel;
}